

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInMain_Test::
~Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInMain_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInMain_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInMain)
{
    libcellml::ImporterPtr importer;
    libcellml::ModelPtr model;

    setupFlattenImportedUnits(importer, model, "main");

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(3), flatModel->unitsCount());
    EXPECT_EQ("fmol", flatModel->units(0)->name());
    EXPECT_EQ("per_fmol", flatModel->units(1)->name());
    EXPECT_EQ("fmol", flatModel->units(2)->name());
}